

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::format<unsigned_long,std::basic_string_view<char,std::char_traits<char>>>
               (ostream *out,char *fmt,unsigned_long *args,
               basic_string_view<char,_std::char_traits<char>_> *args_1)

{
  long in_FS_OFFSET;
  FormatList local_48;
  FormatArg local_38;
  basic_string_view<char,_std::char_traits<char>_> *local_20;
  code *local_18;
  code *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.m_args = &local_38;
  local_48.m_N = 2;
  local_38.m_formatImpl = detail::FormatArg::formatImpl<unsigned_long>;
  local_38.m_toIntImpl = detail::FormatArg::toIntImpl<unsigned_long>;
  local_18 = detail::FormatArg::formatImpl<std::basic_string_view<char,std::char_traits<char>>>;
  local_10 = detail::FormatArg::toIntImpl<std::basic_string_view<char,std::char_traits<char>>>;
  local_38.m_value = args;
  local_20 = args_1;
  vformat(out,fmt,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}